

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.h
# Opt level: O0

int __thiscall
CVmMetaTable::prop_to_vector_idx(CVmMetaTable *this,uint reg_table_idx,vm_prop_id_t prop)

{
  unsigned_short uVar1;
  vm_meta_entry_t *this_00;
  vm_prop_id_t in_DX;
  undefined4 in_ESI;
  vm_meta_entry_t *entry;
  undefined8 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  this_00 = get_entry_from_reg((CVmMetaTable *)
                               CONCAT44(in_ESI,CONCAT22(in_DX,in_stack_ffffffffffffffe8)),
                               (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (this_00 == (vm_meta_entry_t *)0x0) {
    local_4 = 0;
  }
  else {
    uVar1 = vm_meta_entry_t::xlat_prop(this_00,in_DX);
    local_4 = (uint)uVar1;
  }
  return local_4;
}

Assistant:

int prop_to_vector_idx(uint reg_table_idx, vm_prop_id_t prop)
    {
        /* get the entry for the registration table index */
        vm_meta_entry_t *entry = get_entry_from_reg(reg_table_idx);
        
        /* 
         *   if there's no entry for this registration index, there's
         *   obviously no metaclass function mapping for the property 
         */
        if (entry == 0)
            return 0;

        /* return the property translation */
        return entry->xlat_prop(prop);
    }